

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

_Bool parse_required(gravity_parser_t *parser,gtoken_t token)

{
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  _Bool _Var1;
  gtoken_t token_01;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_R9;
  gtoken_s unexpected_token;
  
  _Var1 = parse_optional(parser,token);
  if (!_Var1) {
    lexer = parser->lexer->p[parser->lexer->n - 1];
    token_01 = gravity_lexer_next(lexer);
    gravity_lexer_token(lexer);
    pcVar2 = token_name(token);
    pcVar3 = token_name(token_01);
    token_00.lineno = unexpected_token.lineno;
    token_00.type = unexpected_token.type;
    token_00.colno = unexpected_token.colno;
    token_00.position = unexpected_token.position;
    token_00.bytes = unexpected_token.bytes;
    token_00.length = unexpected_token.length;
    token_00.fileid = unexpected_token.fileid;
    token_00.builtin = unexpected_token.builtin;
    token_00.value = unexpected_token.value;
    report_error(parser,GRAVITY_ERROR_SYNTAX,token_00,"Expected %s but found %s.",pcVar2,pcVar3,
                 in_R9);
  }
  return _Var1;
}

Assistant:

static bool parse_required (gravity_parser_t *parser, gtoken_t token) {
    if (parse_optional(parser, token)) return true;

    // token not found (and not consumed) so an error strategy must be implemented here

    // simple (but not simpler) error recovery
    // parser should keep track of what I am parsing
    // so based on tok I could have a token list of terminal symbols
    // call next until first sync symbol (or EOF or start of another terminal symbol is found)

    // simple error recovery, just consume next and report error
    DECLARE_LEXER;
    gtoken_t next = gravity_lexer_next(lexer);
    gtoken_s unexpected_token = gravity_lexer_token(lexer);
    REPORT_ERROR(unexpected_token, "Expected %s but found %s.", token_name(token), token_name(next));
    return false;
}